

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_util.hpp
# Opt level: O2

person * __thiscall
rest_rpc::get_result<person>(person *__return_storage_ptr__,rest_rpc *this,string_view result)

{
  tuple<int,_person> tp;
  msgpack_codec codec;
  undefined1 auStack_68 [56];
  msgpack_codec local_30;
  
  local_30.msg_.m_obj.super_object.type = NIL;
  local_30.msg_.m_zone._M_t.
  super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
  super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
  super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
       (__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>)0x0;
  rpc_service::msgpack_codec::unpack<std::tuple<int,person>>
            ((tuple<int,_person> *)auStack_68,&local_30,(char *)this,(size_t)result.data_);
  person::person(__return_storage_ptr__,(person *)auStack_68);
  std::__cxx11::string::~string((string *)(auStack_68 + 8));
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr
            (&local_30.msg_.m_zone);
  return __return_storage_ptr__;
}

Assistant:

inline T get_result(string_view result) {
  rpc_service::msgpack_codec codec;
  auto tp = codec.unpack<std::tuple<int, T>>(result.data(), result.size());
  return std::get<1>(tp);
}